

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::Flush
          (ProducerEndpointImpl *this,FlushRequestID flush_request_id,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *data_sources)

{
  TaskRunner *pTVar1;
  element_type *ppPVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 *puVar4;
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_88;
  FlushRequestID local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this,
               (__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&this->weak_ptr_factory_);
  pTVar1 = this->task_runner_;
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_88,
               (__shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this);
  local_78 = flush_request_id;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,data_sources);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  puVar4 = (undefined8 *)operator_new(0x30);
  _Var3._M_pi = local_88._M_refcount._M_pi;
  ppPVar2 = local_88._M_ptr;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_ptr = (element_type *)0x0;
  *puVar4 = ppPVar2;
  puVar4[1] = _Var3._M_pi;
  puVar4[2] = local_78;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar4 + 3),&local_70);
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60063:26)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60063:26)>
             ::_M_manager;
  local_58._M_unused._M_object = puVar4;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  Flush(unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)::$_0::~__0
            ((__0 *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&weak_this.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::Flush(
    FlushRequestID flush_request_id,
    const std::vector<DataSourceInstanceID>& data_sources) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, flush_request_id, data_sources] {
    if (weak_this) {
      weak_this->producer_->Flush(flush_request_id, data_sources.data(),
                                  data_sources.size());
    }
  });
}